

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedHybridMeshControl.cpp
# Opt level: O2

void __thiscall
TPZMHMixedHybridMeshControl::CreateInternalFluxElements(TPZMHMixedHybridMeshControl *this)

{
  TPZGeoMesh *this_00;
  TPZCompMesh *this_01;
  long lVar1;
  long lVar2;
  int iVar3;
  mapped_type *this_02;
  TPZGeoEl *gel;
  TPZCompEl *cel;
  _Base_ptr p_Var4;
  long lVar5;
  int64_t el;
  long iel;
  _Self __tmp;
  TPZCompMesh *cmeshHDiv;
  TPZCompMesh *local_38;
  
  this_00 = ((this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fGMesh.fRef)->fPointer;
  iVar3 = this_00->fDim;
  this_01 = ((this->super_TPZMHMixedMeshControl).fFluxMesh.fRef)->fPointer;
  local_38 = this_01;
  TPZGeoMesh::ResetReference(this_00);
  TPZCompMesh::LoadReferences(this_01);
  this_01->fDimModel = iVar3;
  TPZCreateApproximationSpace::SetAllCreateFunctionsHDiv(&this_01->fCreate,iVar3);
  this_01->fDefaultOrder =
       (this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fpOrderInternal;
  this_02 = std::
            map<TPZCompMesh_*,_TPZManVector<long,_10>,_std::less<TPZCompMesh_*>,_std::allocator<std::pair<TPZCompMesh_*const,_TPZManVector<long,_10>_>_>_>
            ::operator[](&(this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.
                          fConnectToSubDomainIdentifier,&local_38);
  TPZManVector<long,_10>::Expand(this_02,10000);
  p_Var4 = *(_Base_ptr *)
            ((long)&(this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fMHMtoSubCMesh._M_t.
                    _M_impl.super__Rb_tree_header._M_header + 0x10);
  lVar5 = (((this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fGMesh.fRef)->fPointer->
          fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
  if (lVar5 < 1) {
    lVar5 = 0;
  }
  while( true ) {
    TPZGeoMesh::ResetReference
              (((this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fGMesh.fRef)->fPointer);
    if ((_Rb_tree_header *)p_Var4 ==
        &(this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fMHMtoSubCMesh._M_t._M_impl.
         super__Rb_tree_header) break;
    lVar1 = *(long *)(p_Var4 + 1);
    for (iel = 0; lVar5 != iel; iel = iel + 1) {
      gel = TPZGeoMesh::Element(((this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fGMesh.
                                fRef)->fPointer,iel);
      if (gel != (TPZGeoEl *)0x0) {
        (**(code **)(*(long *)gel + 0x210))(gel);
        lVar2 = (this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fGeoToMHMDomain.
                super_TPZVec<long>.fStore[iel];
        iVar3 = (**(code **)(*(long *)gel + 0x210))(gel);
        if (iVar3 == ((this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fGMesh.fRef)->
                     fPointer->fDim) {
          iVar3 = (**(code **)(*(long *)gel + 0x1d0))(gel);
          if ((iVar3 == 0) && (lVar2 == lVar1)) {
            cel = TPZCompMesh::CreateCompEl(local_38,gel);
            TPZMHMeshControl::SetSubdomain((TPZMHMeshControl *)this,cel,*(int64_t *)(p_Var4 + 1));
          }
        }
      }
    }
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
  }
  (**(code **)(*(long *)((this->super_TPZMHMixedMeshControl).fFluxMesh.fRef)->fPointer + 0x60))();
  SplitFluxElementsAroundFractures(this);
  CreateHDivWrappers(this);
  return;
}

Assistant:

void TPZMHMixedHybridMeshControl::CreateInternalFluxElements()
{
    TPZGeoMesh *gmesh = fGMesh.operator->();
    int meshdim = gmesh->Dimension();
    TPZCompMesh * cmeshHDiv = fFluxMesh.operator->();
    gmesh->ResetReference();
    cmeshHDiv->LoadReferences();
    cmeshHDiv->SetDimModel(meshdim);
    cmeshHDiv->ApproxSpace().SetAllCreateFunctionsHDiv(meshdim);
    cmeshHDiv->SetDefaultOrder(fpOrderInternal);
    
    //Criar elementos computacionais malha MHM
    
    TPZGeoEl *gel = NULL;
    TPZGeoEl *gsubel = NULL;
    fConnectToSubDomainIdentifier[cmeshHDiv].Expand(10000);
    int64_t nel = fGMesh->NElements();
    
    for (auto it= this->fMHMtoSubCMesh.begin(); it != this->fMHMtoSubCMesh.end(); it++)
    {
        fGMesh->ResetReference();
        int64_t MHMIndex = it->first;
        for (int64_t el = 0; el< nel; el++) {
            TPZGeoEl *gel = fGMesh->Element(el);
            if(!gel) continue;
            int geldim = gel->Dimension();
            int64_t gelMHM = fGeoToMHMDomain[el];
            if(!gel || gel->Dimension() != fGMesh->Dimension() || gel->HasSubElement() || gelMHM != MHMIndex)
            {
                continue;
            }
            // create the flux element
            
            TPZCompEl *cel = cmeshHDiv->CreateCompEl(gel);
            /// associate the connects with the subdomain
            SetSubdomain(cel, it->first);
        }
    }
    
    fGMesh->ResetReference();    
    fFluxMesh->ExpandSolution();
    
    SplitFluxElementsAroundFractures();

    CreateHDivWrappers();
}